

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O0

void __thiscall HighsMipAnalysis::reportMipTimer(HighsMipAnalysis *this)

{
  HighsTimerClock *in_RDI;
  MipTimer *unaff_retaddr;
  HighsTimerClock *in_stack_00000018;
  MipTimer *in_stack_00000020;
  MipTimer mip_timer;
  bool in_stack_0000008e;
  bool in_stack_0000008f;
  HighsTimerClock *in_stack_00000090;
  string *in_stack_00000098;
  MipTimer *in_stack_000000a0;
  string local_60 [48];
  string local_30 [24];
  HighsTimerClock *in_stack_ffffffffffffffe8;
  MipTimer *in_stack_fffffffffffffff0;
  HighsTimerClock *mip_timer_clock;
  
  if (((ulong)in_RDI[2].clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start & 1) != 0) {
    mip_timer_clock = in_RDI;
    MipTimer::reportMipCoreClock(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    MipTimer::reportMipLevel1Clock(unaff_retaddr,mip_timer_clock);
    MipTimer::reportMipEvaluateRootNodeClock(in_stack_00000020,in_stack_00000018);
    MipTimer::reportMipSolveLpClock(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    std::__cxx11::string::string(local_30,(string *)&in_RDI->clock_);
    MipTimer::csvEvaluateRootNodeClock
              (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008f,
               in_stack_0000008e);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::string(local_60,(string *)&in_RDI->clock_);
    MipTimer::csvEvaluateRootNodeClock
              (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008f,
               in_stack_0000008e);
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void HighsMipAnalysis::reportMipTimer() {
  if (!analyse_mip_time) return;
  MipTimer mip_timer;
  mip_timer.reportMipCoreClock(mip_clocks);
  mip_timer.reportMipLevel1Clock(mip_clocks);
  mip_timer.reportMipEvaluateRootNodeClock(mip_clocks);
  //  mip_timer.reportAltEvaluateRootNodeClock(mip_clocks);
  //  mip_timer.reportMipPresolveClock(mip_clocks);
  //  mip_timer.reportMipSeparationClock(mip_clocks);
  //  mip_timer.reportMipSearchClock(mip_clocks);
  //  mip_timer.reportMipDiveClock(mip_clocks);
  //  mip_timer.reportMipNodeSearchClock(mip_clocks);
  //  mip_timer.reportMipDivePrimalHeuristicsClock(mip_clocks);
  //  mip_timer.reportMipSubMipSolveClock(mip_clocks);
  mip_timer.reportMipSolveLpClock(mip_clocks);
  //  mip_timer.csvMipClock(this->model_name, mip_clocks, true, false);
  //  reportMipSolveLpClock(true);
  //  mip_timer.csvMipClock(this->model_name, mip_clocks, false, false);
  //  reportMipSolveLpClock(false);
  mip_timer.csvEvaluateRootNodeClock(this->model_name, mip_clocks, true, true);
  mip_timer.csvEvaluateRootNodeClock(this->model_name, mip_clocks, false, true);
  //  analyseVectorValues(nullptr, "Node search time",
  //                      HighsInt(node_search_time.size()), node_search_time);
  //  analyseVectorValues(nullptr, "Dive time", HighsInt(dive_time.size()),
  //                      dive_time);
}